

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

void __thiscall
TxConfirmStats::removeTx
          (TxConfirmStats *this,uint entryHeight,uint nBestSeenHeight,uint bucketindex,bool inBlock)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  undefined1 auVar4 [16];
  string_view source_file;
  bool bVar5;
  Logger *pLVar6;
  pointer piVar7;
  ulong uVar8;
  int iVar9;
  pointer pvVar10;
  uint uVar11;
  long lVar12;
  uint *args_1;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file_00;
  string_view source_file_01;
  uint blockIndex;
  string log_msg;
  char *in_stack_ffffffffffffff00;
  uint *in_stack_ffffffffffffff08;
  undefined4 local_e4;
  uint local_e0 [26];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = nBestSeenHeight - entryHeight;
  if (nBestSeenHeight == 0) {
    uVar11 = 0;
  }
  local_e0[0] = bucketindex;
  if ((int)uVar11 < 0) {
    pLVar6 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,ESTIMATEFEE,Debug);
    if (bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        logging_function_00._M_str = "removeTx";
        logging_function_00._M_len = 8;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_00._M_len = 0x58;
        ::LogPrintf_<>(logging_function_00,source_file_00,0x1e8,ESTIMATEFEE,Debug,
                       "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;
      }
      goto LAB_0027d7b2;
    }
  }
  else {
    pvVar2 = (this->unconfTxs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    args_1 = (uint *)(((long)(this->unconfTxs).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                     -0x5555555555555555);
    if ((int)uVar11 < (int)args_1) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = args_1;
      local_e4 = SUB164(ZEXT416(entryHeight) % auVar4,0);
      piVar7 = pvVar2[SUB168(ZEXT416(entryHeight) % auVar4,0)].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar9 = piVar7[bucketindex];
      if (iVar9 < 1) {
        pLVar6 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,ESTIMATEFEE,Debug);
        if (bVar5) {
          pLVar6 = LogInstance();
          bVar5 = BCLog::Logger::Enabled(pLVar6);
          if (bVar5) {
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            tinyformat::format<unsigned_int,unsigned_int>
                      (&local_78,
                       (tinyformat *)
                       "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n"
                       ,(char *)&local_e4,local_e0,args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar6 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x58;
            local_78._M_string_length = 0x81cc4d;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
            ;
            source_file._M_len = 0x58;
            str._M_str = local_58._M_dataplus._M_p;
            str._M_len = local_58._M_string_length;
            logging_function._M_str = "removeTx";
            logging_function._M_len = 8;
            BCLog::Logger::LogPrintStr
                      (pLVar6,str,logging_function,source_file,0x1fa,ESTIMATEFEE,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
      else {
LAB_0027d670:
        piVar7[bucketindex] = iVar9 + -1;
      }
    }
    else {
      piVar7 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar7[bucketindex];
      if (0 < iVar9) goto LAB_0027d670;
      pLVar6 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,ESTIMATEFEE,Debug);
      if (bVar5) {
        logging_function_01._M_str = "removeTx";
        logging_function_01._M_len = 8;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_01._M_len = 0x58;
        LogPrintf_<unsigned_int>
                  (logging_function_01,source_file_01,0x1f1,
                   IPC|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|ESTIMATEFEE|ZMQ|HTTP|TOR,(Level)local_e0,
                   in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
      }
    }
    if ((!inBlock) && (uVar1 = this->scale, uVar1 <= uVar11)) {
      if (uVar1 == 0) {
        __assert_fail("scale != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                      ,0x1fe,
                      "void TxConfirmStats::removeTx(unsigned int, unsigned int, unsigned int, bool)"
                     );
      }
      uVar8 = 0;
      pvVar10 = (this->failAvg).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)(this->failAvg).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10;
      do {
        if ((lVar12 >> 3) * -0x5555555555555555 - uVar8 == 0) break;
        lVar3 = *(long *)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        *(double *)(lVar3 + (ulong)local_e0[0] * 8) =
             *(double *)(lVar3 + (ulong)local_e0[0] * 8) + 1.0;
        uVar8 = uVar8 + 1;
        pvVar10 = pvVar10 + 1;
      } while (uVar8 < (ulong)uVar11 / (ulong)uVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0027d7b2:
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::removeTx(unsigned int entryHeight, unsigned int nBestSeenHeight, unsigned int bucketindex, bool inBlock)
{
    //nBestSeenHeight is not updated yet for the new block
    int blocksAgo = nBestSeenHeight - entryHeight;
    if (nBestSeenHeight == 0)  // the BlockPolicyEstimator hasn't seen any blocks yet
        blocksAgo = 0;
    if (blocksAgo < 0) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;  //This can't happen because we call this with our best seen height, no entries can have higher
    }

    if (blocksAgo >= (int)unconfTxs.size()) {
        if (oldUnconfTxs[bucketindex] > 0) {
            oldUnconfTxs[bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from >25 blocks,bucketIndex=%u already\n",
                     bucketindex);
        }
    }
    else {
        unsigned int blockIndex = entryHeight % unconfTxs.size();
        if (unconfTxs[blockIndex][bucketindex] > 0) {
            unconfTxs[blockIndex][bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n",
                     blockIndex, bucketindex);
        }
    }
    if (!inBlock && (unsigned int)blocksAgo >= scale) { // Only counts as a failure if not confirmed for entire period
        assert(scale != 0);
        unsigned int periodsAgo = blocksAgo / scale;
        for (size_t i = 0; i < periodsAgo && i < failAvg.size(); i++) {
            failAvg[i][bucketindex]++;
        }
    }
}